

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtrackinglinesearch.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
backtrackingLineSearch::optimize
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          backtrackingLineSearch *this)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  _func_double_vector<double,_std::allocator<double>_> *p_Var2;
  _func_vector<double,_std::allocator<double>_>_vector<double,_std::allocator<double>_> *p_Var3;
  vector<double,_std::allocator<double>_> vVar4;
  vector<double,_std::allocator<double>_> vVar5;
  vector<double,_std::allocator<double>_> vVar6;
  vector<double,_std::allocator<double>_> vVar7;
  vector<double,_std::allocator<double>_> vVar8;
  vector<double,_std::allocator<double>_> vVar9;
  vector<double,_std::allocator<double>_> vVar10;
  pointer pdVar11;
  vector<double,_std::allocator<double>_> *pvVar12;
  ostream *poVar13;
  vector<double,_std::allocator<double>_> *dF;
  double *pdVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  double dVar18;
  pointer pdVar19;
  initializer_list<double> __l;
  undefined8 in_stack_fffffffffffffe58;
  pointer pdVar20;
  undefined8 in_stack_fffffffffffffe60;
  pointer in_stack_fffffffffffffe68;
  double local_188;
  vector<double,_std::allocator<double>_> local_178;
  ofstream *local_160;
  ulong local_158;
  vector<double,_std::allocator<double>_> *local_150;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  vector<double,_std::allocator<double>_> local_118;
  vector<double,_std::allocator<double>_> local_100;
  vector<double,_std::allocator<double>_> local_e8;
  vector<double,_std::allocator<double>_> local_d0;
  vector<double,_std::allocator<double>_> local_b8;
  vector<double,_std::allocator<double>_> local_a0;
  vector<double,_std::allocator<double>_> local_88;
  void *local_70 [2];
  long local_60;
  double local_58;
  double dStack_50;
  vector<double,_std::allocator<double>_> local_48;
  
  local_188 = this->alpha;
  local_140 = this->alpha_dec;
  local_148 = this->alpha_inc;
  local_150 = __return_storage_ptr__;
  if ((this->super_optimizer).verbose != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Initial SOLUTION : (",0x14);
    poVar13 = std::ostream::_M_insert<double>
                        (*(this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,",",1);
    pvVar1 = &this->x;
    poVar13 = std::ostream::_M_insert<double>
                        ((pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    poVar13 = std::ostream::_M_insert<double>
                        (*(this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
    poVar13 = std::ostream::_M_insert<double>
                        ((pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
    p_Var2 = this->f;
    std::vector<double,_std::allocator<double>_>::vector(&local_100,pvVar1);
    vVar4.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)in_stack_fffffffffffffe60;
    vVar4.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)in_stack_fffffffffffffe58;
    vVar4.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = in_stack_fffffffffffffe68;
    dVar18 = (*p_Var2)(vVar4);
    poVar13 = std::ostream::_M_insert<double>(dVar18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    if (local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  pvVar1 = &this->x;
  local_160 = &(this->super_optimizer).logFile;
  uVar17 = 0;
  pdVar20 = (pointer)0x0;
  pdVar14 = (double *)0x0;
  do {
    p_Var3 = this->df;
    pdVar19 = pdVar20;
    local_158 = uVar17;
    std::vector<double,_std::allocator<double>_>::vector(&local_88,pvVar1);
    vVar5.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)in_stack_fffffffffffffe60;
    vVar5.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = pdVar20;
    vVar5.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pdVar19;
    (*p_Var3)((vector<double,_std::allocator<double>_> *)local_70,vVar5);
    utils::Delta(&local_178,(utils *)local_70,dF);
    pdVar20 = local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    pdVar11 = local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (double *)0x0;
    local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (pdVar14 != (double *)0x0) {
      operator_delete(pdVar14,(long)pdVar19 - (long)pdVar14);
      if (local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    if (local_70[0] != (void *)0x0) {
      operator_delete(local_70[0],local_60 - (long)local_70[0]);
    }
    if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    while( true ) {
      p_Var2 = this->f;
      pdVar14 = (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_58 = local_188 * *pdVar11 + *pdVar14;
      dStack_50 = local_188 * pdVar11[1] + pdVar14[1];
      __l._M_len = 2;
      __l._M_array = &local_58;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_a0,__l,(allocator_type *)&stack0xfffffffffffffe67);
      vVar6.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)in_stack_fffffffffffffe60;
      vVar6.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = pdVar20;
      vVar6.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar19;
      dVar18 = (*p_Var2)(vVar6);
      p_Var2 = this->f;
      std::vector<double,_std::allocator<double>_>::vector(&local_b8,pvVar1);
      vVar7.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)in_stack_fffffffffffffe60;
      vVar7.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = pdVar20;
      vVar7.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar19;
      pdVar19 = (pointer)(*p_Var2)(vVar7);
      local_120 = this->wolfe_para;
      p_Var3 = this->df;
      std::vector<double,_std::allocator<double>_>::vector(&local_d0,pvVar1);
      vVar8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)in_stack_fffffffffffffe60;
      vVar8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = pdVar20;
      vVar8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar19;
      (*p_Var3)(&local_178,vVar8);
      local_128 = *local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start * local_188;
      local_130 = *pdVar11;
      p_Var3 = this->df;
      std::vector<double,_std::allocator<double>_>::vector(&local_e8,pvVar1);
      vVar9.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)in_stack_fffffffffffffe60;
      vVar9.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = pdVar20;
      vVar9.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar19;
      (*p_Var3)(&local_48,vVar9);
      local_138 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[1] * local_188 * pdVar11[1];
      operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
      if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (dVar18 <= local_120 * (local_128 * local_130 + local_138) + (double)pdVar19) break;
      local_188 = local_188 * local_140;
      if ((this->super_optimizer).verbose != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Dec Alpha to: ",0xe);
        poVar13 = std::ostream::_M_insert<double>(this->alpha);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
      }
    }
    pdVar14 = (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    *pdVar14 = *pdVar11 * local_188 + *pdVar14;
    pdVar14[1] = pdVar11[1] * local_188 + pdVar14[1];
    iVar15 = (int)local_158;
    if ((this->super_optimizer).verbose != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"########### NEW SOLUTION ########### : (",0x28);
      poVar13 = std::ostream::_M_insert<double>
                          (*(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,",",1);
      poVar13 = std::ostream::_M_insert<double>
                          ((pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      poVar13 = std::ostream::_M_insert<double>
                          (*(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
      poVar13 = std::ostream::_M_insert<double>
                          ((pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
      p_Var2 = this->f;
      std::vector<double,_std::allocator<double>_>::vector(&local_118,pvVar1);
      vVar10.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)in_stack_fffffffffffffe60;
      vVar10.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = pdVar20;
      vVar10.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar19;
      dVar18 = (*p_Var2)(vVar10);
      poVar13 = std::ostream::_M_insert<double>(dVar18);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      iVar15 = (int)local_158;
      if (local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    local_188 = local_188 * local_148;
    uVar16 = iVar15 + (uint)(SQRT(local_188 * pdVar11[1] * local_188 * pdVar11[1] +
                                  local_188 * *pdVar11 * local_188 * *pdVar11) < this->tol);
    uVar17 = (ulong)uVar16;
    pdVar14 = pdVar11;
  } while (uVar16 < 10);
  std::ofstream::close();
  pvVar12 = local_150;
  std::vector<double,_std::allocator<double>_>::vector(local_150,pvVar1);
  operator_delete(pdVar11,(long)pdVar20 - (long)pdVar11);
  return pvVar12;
}

Assistant:

vector<double> backtrackingLineSearch::optimize(){
    uint count=0;
    //local variable for that optimization problem
    double alpha_=alpha;
    double alpha_dec_=alpha_dec;
    double alpha_inc_=alpha_inc;
    vector<double> delta;
    if (verbose!=0){
        cout << "Initial SOLUTION : ("<< x[0] << ","<< x[1]<<")"<<endl;
        logFile<<x[0]<<" "<<x[1]<<" "<<f(x)<<endl;
    }
    while (count<10){
        delta=utils::Delta(df(x));
        while (f({x[0]+alpha_*delta[0],x[1]+alpha_*delta[1]})>f(x)+wolfe_para*(df(x)[0]*alpha_*delta[0]+df(x)[1]*alpha_*delta[1])){
            alpha_*=alpha_dec_;
            if(verbose!=0) cout<<"Dec Alpha to: "<<alpha<<endl;
        }
        x[0]+=alpha_*delta[0];
        x[1]+=alpha_*delta[1];
        alpha_*=alpha_inc_;
        if (verbose!=0){
            cout << "########### NEW SOLUTION ########### : ("<< x[0] << ","<< x[1]<<")"<<endl;
            logFile<<x[0]<<" "<<x[1]<<" "<<f(x)<<endl;
        }
        // terminaltion rule for the inner loop
        if(sqrt(pow(alpha_*delta[0],2)+pow(alpha_*delta[1],2))<tol)count++;
        }
    logFile.close();
    return x;
}